

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.cpp
# Opt level: O3

bool duckdb::TryDecimalSubtract::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
               (hugeint_t left,hugeint_t right,hugeint_t *result)

{
  bool bVar1;
  hugeint_t rhs;
  hugeint_t local_20;
  
  rhs.upper = right.upper;
  result->lower = left.lower;
  result->upper = left.upper;
  rhs.lower = rhs.upper;
  bVar1 = Hugeint::TrySubtractInPlace((Hugeint *)result,(hugeint_t *)right.lower,rhs);
  if (bVar1) {
    local_20 = hugeint_t::operator-((hugeint_t *)(Hugeint::POWERS_OF_TEN + 0x260));
    bVar1 = hugeint_t::operator<=(result,&local_20);
    if (!bVar1) {
      bVar1 = hugeint_t::operator>=(result,(hugeint_t *)(Hugeint::POWERS_OF_TEN + 0x260));
      return !bVar1;
    }
  }
  return false;
}

Assistant:

bool TryDecimalSubtract::Operation(hugeint_t left, hugeint_t right, hugeint_t &result) {
	if (!TrySubtractOperator::Operation(left, right, result)) {
		return false;
	}
	if (result <= -Hugeint::POWERS_OF_TEN[38] || result >= Hugeint::POWERS_OF_TEN[38]) {
		return false;
	}
	return true;
}